

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alternate_shared_mutex.hpp
# Opt level: O0

bool __thiscall
yamc::alternate::basic_shared_timed_mutex<yamc::rwlock::ReaderPrefer>::
do_try_lockwait<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>
          (basic_shared_timed_mutex<yamc::rwlock::ReaderPrefer> *this,
          time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
          *tp)

{
  bool bVar1;
  cv_status cVar2;
  undefined1 local_30 [8];
  unique_lock<std::mutex> lk;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *tp_local;
  basic_shared_timed_mutex<yamc::rwlock::ReaderPrefer> *this_local;
  
  lk._8_8_ = tp;
  std::unique_lock<std::mutex>::unique_lock
            ((unique_lock<std::mutex> *)local_30,
             &(this->super_shared_mutex_base<yamc::rwlock::ReaderPrefer>).mtx_);
  rwlock::ReaderPrefer::before_wait_wlock((state *)this);
  do {
    bVar1 = rwlock::ReaderPrefer::wait_wlock((state *)this);
    if (!bVar1) goto LAB_0013e45d;
    cVar2 = std::condition_variable::
            wait_until<std::chrono::duration<long,std::ratio<1l,1000000000l>>>
                      (&(this->super_shared_mutex_base<yamc::rwlock::ReaderPrefer>).cv_,
                       (unique_lock<std::mutex> *)local_30,
                       (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                        *)lk._8_8_);
  } while (cVar2 != timeout);
  bVar1 = rwlock::ReaderPrefer::wait_wlock((state *)this);
  if (bVar1) {
    rwlock::ReaderPrefer::after_wait_wlock((state *)this);
    this_local._7_1_ = false;
  }
  else {
LAB_0013e45d:
    rwlock::ReaderPrefer::after_wait_wlock((state *)this);
    rwlock::ReaderPrefer::acquire_wlock((state *)this);
    this_local._7_1_ = true;
  }
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_30);
  return this_local._7_1_;
}

Assistant:

bool do_try_lockwait(const std::chrono::time_point<Clock, Duration>& tp)
  {
    std::unique_lock<decltype(mtx_)> lk(mtx_);
    RwLockPolicy::before_wait_wlock(state_);
    while (RwLockPolicy::wait_wlock(state_)) {
      if (cv_.wait_until(lk, tp) == std::cv_status::timeout) {
        if (!RwLockPolicy::wait_wlock(state_))  // re-check predicate
          break;
        RwLockPolicy::after_wait_wlock(state_);
        return false;
      }
    }
    RwLockPolicy::after_wait_wlock(state_);
    RwLockPolicy::acquire_wlock(state_);
    return true;
  }